

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O1

void __thiscall embree::CoronaLoader::loadMapDefinition(CoronaLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  int iVar1;
  mapped_type *pmVar2;
  runtime_error *prVar3;
  long *plVar4;
  size_type *psVar5;
  long *plVar6;
  shared_ptr<embree::Texture> texture;
  string name;
  undefined1 local_88 [32];
  string local_68;
  string local_48;
  
  iVar1 = std::__cxx11::string::compare((char *)&xml->ptr->name);
  if (iVar1 != 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    ParseLocation::str_abi_cxx11_(&local_48,&xml->ptr->loc);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
    local_88._0_8_ = *plVar4;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_88._0_8_ == psVar5) {
      local_88._16_8_ = *psVar5;
      local_88._24_8_ = plVar4[3];
      local_88._0_8_ = local_88 + 0x10;
    }
    else {
      local_88._16_8_ = *psVar5;
    }
    local_88._8_8_ = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::operator+(&local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   &xml->ptr->name);
    std::runtime_error::runtime_error(prVar3,(string *)&local_68);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = xml->ptr;
  if ((long)(this_00->children).
            super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this_00->children).
            super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    local_88._0_8_ = (element_type *)(local_88 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"name","");
    XML::parm(&local_68,this_00,(string *)local_88);
    if ((element_type *)local_88._0_8_ != (element_type *)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_);
    }
    loadMap((CoronaLoader *)local_88,(Ref<embree::XML> *)this);
    if ((element_type *)local_88._0_8_ != (element_type *)0x0) {
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
               ::operator[](&this->textureMap,&local_68);
      (pmVar2->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)local_88._0_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar2->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    return;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_((string *)local_88,&xml->ptr->loc);
  plVar4 = (long *)std::__cxx11::string::append(local_88);
  local_68._M_dataplus._M_p = (pointer)*plVar4;
  plVar6 = plVar4 + 2;
  if ((long *)local_68._M_dataplus._M_p == plVar6) {
    local_68.field_2._M_allocated_capacity = *plVar6;
    local_68.field_2._8_8_ = plVar4[3];
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = *plVar6;
  }
  local_68._M_string_length = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::runtime_error::runtime_error(prVar3,(string *)&local_68);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void CoronaLoader::loadMapDefinition(const Ref<XML>& xml) 
  {
    if (xml->name != "mapDefinition") 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid map definition: "+xml->name);
    if (xml->children.size() != 1) 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid map definition");

    const std::string name = xml->parm("name");
    std::shared_ptr<Texture> texture = loadMap(xml->children[0]);
    if (texture) textureMap[name] = texture;
  }